

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int tx_get_lengths(wally_tx *tx,tx_serialize_opts *opts,uint32_t flags,size_t *base_size,
                  size_t *witness_size,size_t *witness_count,_Bool is_elements)

{
  wally_tx_input *pwVar1;
  wally_tx_output *pwVar2;
  uint64_t uVar3;
  wally_tx_witness_stack *pwVar4;
  byte bVar5;
  byte bVar6;
  _Bool _Var7;
  int iVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  size_t sVar12;
  size_t *psVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  ulong uVar17;
  uint64_t v;
  uint64_t uVar18;
  size_t sVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  bool bVar23;
  
  if (opts == (tx_serialize_opts *)0x0) {
    bVar5 = 0;
    bVar6 = 0;
    bVar22 = false;
    bVar23 = false;
  }
  else {
    bVar5 = (byte)opts->sighash >> 7;
    bVar6 = ((byte)opts->sighash & 0x40) >> 6;
    bVar22 = (opts->sighash & 0x1f) == 2;
    bVar23 = (opts->sighash & 0x1f) == 3;
  }
  *witness_count = 0;
  _Var7 = is_valid_tx(tx);
  if (_Var7) {
    if (opts == (tx_serialize_opts *)0x0) {
LAB_00110408:
      if (0xf < flags) goto LAB_00110482;
      if (((flags & 1) != 0) && (iVar8 = wally_tx_get_witness_count(tx,witness_count), iVar8 != 0))
      {
        return -2;
      }
      sVar9 = 1;
      if (bVar5 == 0) {
        sVar9 = tx->num_inputs;
      }
      sVar10 = *witness_count;
      sVar9 = varint_get_length(sVar9);
      sVar12 = 1;
      if (!bVar22) {
        if (bVar23) {
          sVar12 = opts->index + 1;
        }
        else {
          sVar12 = tx->num_outputs;
        }
        sVar12 = varint_get_length(sVar12);
      }
      sVar9 = sVar12 + sVar9 + (ulong)(opts == (tx_serialize_opts *)0x0 && is_elements) +
                               (ulong)(opts != (tx_serialize_opts *)0x0) * 4 + 8;
      if (tx->num_inputs != 0) {
        lVar11 = 0x98;
        sVar12 = 0;
        do {
          pwVar1 = tx->inputs;
          if ((bVar5 == 0) || (sVar12 == opts->index)) {
            if ((pwVar1->txhash[lVar11 + -0x58] & 2) == 0) {
              lVar20 = sVar9 + 0x28;
            }
            else {
              sVar19 = confidential_value_length_from_bytes
                                 (*(uchar **)(pwVar1->txhash + lVar11 + -0x10));
              sVar14 = confidential_value_length_from_bytes(*(uchar **)(pwVar1->txhash + lVar11));
              lVar20 = sVar14 + sVar9 + sVar19 + 0x68;
            }
            if (opts == (tx_serialize_opts *)0x0) {
              psVar13 = (size_t *)(pwVar1->txhash + lVar11 + -0x68);
LAB_001105d7:
              uVar18 = *psVar13;
              sVar9 = varint_get_length(uVar18);
              lVar21 = sVar9 + uVar18;
            }
            else {
              lVar21 = 1;
              psVar13 = &opts->script_len;
              if (sVar12 == opts->index) goto LAB_001105d7;
            }
            sVar9 = lVar21 + lVar20;
          }
          sVar12 = sVar12 + 1;
          lVar11 = lVar11 + 0xd0;
        } while (sVar12 < tx->num_inputs);
      }
      if (!bVar22) {
        if (bVar23) {
          sVar12 = opts->index + 1;
        }
        else {
          sVar12 = tx->num_outputs;
        }
        if (sVar12 != 0) {
          lVar11 = 0x10;
          sVar19 = 0;
          do {
            pwVar2 = tx->outputs;
            if ((bVar23) && (sVar19 != opts->index)) {
              sVar9 = sVar9 + 9;
            }
            else {
              lVar20 = 8;
              if (is_elements) {
                bVar5 = bVar6;
                if ((*(byte *)((long)&pwVar2->script + lVar11) & 1) != 0) {
                  sVar14 = confidential_asset_length_from_bytes
                                     (*(uchar **)((long)&pwVar2->script_len + lVar11));
                  sVar15 = confidential_value_length_from_bytes
                                     (*(uchar **)((long)&pwVar2->asset + lVar11));
                  sVar16 = confidential_nonce_length_from_bytes
                                     (*(uchar **)((long)&pwVar2->value + lVar11));
                  lVar20 = sVar16 + sVar15 + sVar14;
                }
              }
              else {
                bVar5 = 0;
              }
              uVar18 = *(uint64_t *)((long)&pwVar2->satoshi + lVar11);
              sVar14 = varint_get_length(uVar18);
              sVar9 = lVar20 + sVar9 + uVar18 + sVar14;
              if (bVar5 != 0) {
                uVar18 = *(uint64_t *)((long)&pwVar2->surjectionproof_len + lVar11);
                sVar14 = varint_get_length(uVar18);
                uVar3 = *(uint64_t *)((long)&pwVar2->nonce_len + lVar11);
                sVar15 = varint_get_length(uVar3);
                sVar9 = sVar15 + uVar3 + sVar14 + uVar18 + sVar9;
              }
            }
            sVar19 = sVar19 + 1;
            lVar11 = lVar11 + 0x70;
          } while (sVar12 != sVar19);
        }
      }
      *base_size = sVar9;
      sVar9 = 0;
      if (((flags & 1) != 0) && (sVar10 != 0)) {
        if (is_elements) {
          sVar9 = 0;
          if (tx->num_inputs != 0) {
            uVar17 = 0;
            do {
              pwVar1 = tx->inputs;
              uVar18 = pwVar1[uVar17].issuance_amount_rangeproof_len;
              sVar10 = varint_get_length(uVar18);
              uVar3 = pwVar1[uVar17].inflation_keys_rangeproof_len;
              sVar12 = varint_get_length(uVar3);
              if (pwVar1[uVar17].witness == (wally_tx_witness_stack *)0x0) {
                v = 0;
              }
              else {
                v = (pwVar1[uVar17].witness)->num_items;
              }
              sVar19 = varint_get_length(v);
              lVar11 = uVar3 + sVar12 + uVar18 + sVar9 + sVar10 + sVar19;
              if (v != 0) {
                lVar20 = 8;
                do {
                  uVar18 = *(uint64_t *)((long)&(pwVar1[uVar17].witness)->items->witness + lVar20);
                  sVar9 = varint_get_length(uVar18);
                  lVar11 = lVar11 + uVar18 + sVar9;
                  lVar20 = lVar20 + 0x10;
                  v = v - 1;
                } while (v != 0);
              }
              if (pwVar1[uVar17].pegin_witness == (wally_tx_witness_stack *)0x0) {
                uVar18 = 0;
              }
              else {
                uVar18 = (pwVar1[uVar17].pegin_witness)->num_items;
              }
              sVar9 = varint_get_length(uVar18);
              sVar9 = sVar9 + lVar11;
              if (uVar18 != 0) {
                lVar11 = 8;
                do {
                  uVar3 = *(uint64_t *)
                           ((long)&(pwVar1[uVar17].pegin_witness)->items->witness + lVar11);
                  sVar10 = varint_get_length(uVar3);
                  sVar9 = sVar9 + uVar3 + sVar10;
                  lVar11 = lVar11 + 0x10;
                  uVar18 = uVar18 - 1;
                } while (uVar18 != 0);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 < tx->num_inputs);
          }
          if (tx->num_outputs != 0) {
            lVar11 = 0x68;
            uVar17 = 0;
            do {
              pwVar2 = tx->outputs;
              uVar18 = *(uint64_t *)((long)pwVar2 + lVar11 + -0x10);
              sVar10 = varint_get_length(uVar18);
              uVar3 = *(uint64_t *)((long)&pwVar2->satoshi + lVar11);
              sVar12 = varint_get_length(uVar3);
              sVar9 = sVar9 + uVar18 + sVar10 + sVar12 + uVar3;
              uVar17 = uVar17 + 1;
              lVar11 = lVar11 + 0x70;
            } while (uVar17 < tx->num_outputs);
          }
        }
        else if (tx->num_inputs == 0) {
          sVar9 = 2;
        }
        else {
          sVar9 = 2;
          uVar17 = 0;
          do {
            pwVar1 = tx->inputs;
            pwVar4 = pwVar1[uVar17].witness;
            if (pwVar4 == (wally_tx_witness_stack *)0x0) {
              uVar18 = 0;
            }
            else {
              uVar18 = pwVar4->num_items;
            }
            sVar10 = varint_get_length(uVar18);
            sVar9 = sVar10 + sVar9;
            if (uVar18 != 0) {
              lVar11 = 8;
              do {
                uVar3 = *(uint64_t *)((long)&(pwVar1[uVar17].witness)->items->witness + lVar11);
                sVar10 = varint_get_length(uVar3);
                sVar9 = sVar9 + uVar3 + sVar10;
                lVar11 = lVar11 + 0x10;
                uVar18 = uVar18 - 1;
              } while (uVar18 != 0);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 < tx->num_inputs);
        }
      }
    }
    else {
      if ((flags & 1) != 0) {
        return -1;
      }
      if (opts->bip143 != true) goto LAB_00110408;
      uVar18 = opts->script_len;
      sVar9 = varint_get_length(uVar18);
      if (is_elements) {
        sVar10 = confidential_value_length_from_bytes(opts->value);
        lVar11 = sVar10 + 0x20;
        lVar20 = (ulong)bVar6 << 5;
      }
      else {
        lVar11 = 8;
        lVar20 = 0;
      }
      *base_size = lVar11 + uVar18 + sVar9 + lVar20 + 0x94;
      if ((tx->inputs[opts->index].features & 2) != 0) {
        sVar9 = confidential_value_length_from_bytes(tx->inputs[opts->index].issuance_amount);
        sVar10 = confidential_value_length_from_bytes(tx->inputs[opts->index].inflation_keys);
        *base_size = sVar10 + sVar9 + *base_size + 0x40;
      }
      sVar9 = 0;
    }
    *witness_size = sVar9;
    iVar8 = 0;
  }
  else {
LAB_00110482:
    iVar8 = -2;
  }
  return iVar8;
}

Assistant:

static int tx_get_lengths(const struct wally_tx *tx,
                          const struct tx_serialize_opts *opts, uint32_t flags,
                          size_t *base_size, size_t *witness_size,
                          size_t *witness_count, bool is_elements)
{
    size_t n, i, j;
    const bool anyonecanpay = opts && opts->sighash & WALLY_SIGHASH_ANYONECANPAY;
    const bool sh_rangeproof = opts && opts->sighash & WALLY_SIGHASH_RANGEPROOF;
    const bool sh_none = opts && (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_NONE;
    const bool sh_single = opts && (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_SINGLE;

    *witness_count = 0;

    if (!is_valid_tx(tx))
        return WALLY_EINVAL;

    if (opts) {
        if (flags & WALLY_TX_FLAG_USE_WITNESS)
            return WALLY_ERROR; /* Segwit tx hashing uses bip143 opts member */

        if (opts->bip143) {
            *base_size = sizeof(uint32_t) + /* version */
                         SHA256_LEN + /* hash prevouts */
                         SHA256_LEN + /* hash sequence */
                         WALLY_TXHASH_LEN + sizeof(uint32_t) + /* outpoint + index */
                         varbuff_get_length(opts->script_len) + /* script */
                         (is_elements ? confidential_value_length_from_bytes(opts->value) + SHA256_LEN :
                          sizeof(uint64_t)) + /* amount */
                         sizeof(uint32_t) + /* input sequence */
                         SHA256_LEN + /* hash outputs */
                         ((is_elements && sh_rangeproof) ? SHA256_LEN : 0) + /* rangeproof */
                         sizeof(uint32_t) + /* nlocktime */
                         sizeof(uint32_t); /* tx sighash */
#ifdef BUILD_ELEMENTS
            if (tx->inputs[opts->index].features & WALLY_TX_IS_ISSUANCE)
                *base_size += 2 * WALLY_TX_ASSET_TAG_LEN +
                              confidential_value_length_from_bytes(tx->inputs[opts->index].issuance_amount) +
                              confidential_value_length_from_bytes(tx->inputs[opts->index].inflation_keys);
#endif
            *witness_size = 0;
            return WALLY_OK;
        }
    }

    if ((flags & ~WALLY_TX_ALL_FLAGS) ||
        ((flags & WALLY_TX_FLAG_USE_WITNESS) &&
         wally_tx_get_witness_count(tx, witness_count) != WALLY_OK))
        return WALLY_EINVAL;

    if (!*witness_count)
        flags &= ~WALLY_TX_FLAG_USE_WITNESS;

    n = sizeof(tx->version) +
        varint_get_length(anyonecanpay ? 1 : tx->num_inputs) +
        (sh_none ? 1 : varint_get_length(sh_single ? opts->index + 1 : tx->num_outputs)) +
        sizeof(tx->locktime) +
        (opts ? sizeof(leint32_t) : 0); /* Include trailing tx_sighash */

    if (!opts && is_elements)
        n += sizeof(uint8_t); /* witness flag */
    for (i = 0; i < tx->num_inputs; ++i) {
        const struct wally_tx_input *input = tx->inputs + i;
        if (anyonecanpay && i != opts->index)
            continue; /* anyonecanpay only signs the given index */

        n += sizeof(input->txhash) +
             sizeof(input->index) +
             sizeof(input->sequence);

#ifdef BUILD_ELEMENTS
        if (input->features & WALLY_TX_IS_ISSUANCE) {
            n += sizeof(input->blinding_nonce) +
                 sizeof(input->entropy) +
                 confidential_value_length_from_bytes(input->issuance_amount) +
                 confidential_value_length_from_bytes(input->inflation_keys);
        }
#endif

        if (opts) {
            if (i == opts->index)
                n += varbuff_get_length(opts->script_len);
            else
                ++n;
        } else
            n += varbuff_get_length(input->script_len);

    }

    if (!sh_none) {
        size_t num_outputs = sh_single ? opts->index + 1 : tx->num_outputs;

        for (i = 0; i < num_outputs; ++i) {
            const struct wally_tx_output *output = tx->outputs + i;
            if (sh_single && i != opts->index)
                n += sizeof(EMPTY_OUTPUT);
            else {
                if (is_elements && (output->features & WALLY_TX_IS_ELEMENTS)) {
#ifdef BUILD_ELEMENTS
                    n += confidential_asset_length_from_bytes(output->asset) +
                         confidential_value_length_from_bytes(output->value) +
                         confidential_nonce_length_from_bytes(output->nonce);
#endif
                } else
                    n += sizeof(output->satoshi);
                n += varbuff_get_length(output->script_len);

#ifdef BUILD_ELEMENTS
                if (is_elements && sh_rangeproof) {
                    n += varbuff_get_length(output->rangeproof_len) +
                         varbuff_get_length(output->surjectionproof_len);
                }
#endif /* BUILD_ELEMENTS */
            }
        }
    }

    *base_size = n;

    n = 0;
    if (flags & WALLY_TX_FLAG_USE_WITNESS) {
        if (is_elements) {
#ifdef BUILD_ELEMENTS
            for (i = 0; i < tx->num_inputs; ++i) {
                const struct wally_tx_input *input = tx->inputs + i;
                size_t num_items;
                n += varbuff_get_length(input->issuance_amount_rangeproof_len);
                n += varbuff_get_length(input->inflation_keys_rangeproof_len);
                num_items = input->witness ? input->witness->num_items : 0;
                n += varint_get_length(num_items);
                for (j = 0; j < num_items; ++j) {
                    const struct wally_tx_witness_item *stack;
                    stack = input->witness->items + j;
                    n += varbuff_get_length(stack->witness_len);
                }
                num_items = input->pegin_witness ? input->pegin_witness->num_items : 0;
                n += varint_get_length(num_items);
                for (j = 0; j < num_items; ++j) {
                    const struct wally_tx_witness_item *stack;
                    stack = input->pegin_witness->items + j;
                    n += varbuff_get_length(stack->witness_len);
                }
            }

            for (i = 0; i < tx->num_outputs; ++i) {
                const struct wally_tx_output *output = tx->outputs + i;
                n += varbuff_get_length(output->surjectionproof_len);
                n += varbuff_get_length(output->rangeproof_len);
            }
#endif /* BUILD_ELEMENTS */
        } else {
            n = 2; /* For marker and flag bytes 0x00 0x01 */

            for (i = 0; i < tx->num_inputs; ++i) {
                const struct wally_tx_input *input = tx->inputs + i;
                size_t num_items = input->witness ? input->witness->num_items : 0;
                n += varint_get_length(num_items);
                for (j = 0; j < num_items; ++j) {
                    const struct wally_tx_witness_item *stack;
                    stack = input->witness->items + j;
                    n += varbuff_get_length(stack->witness_len);
                }
            }
        }
    }

    *witness_size = n;
    return WALLY_OK;
}